

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.H
# Opt level: O2

void __thiscall Fl_Window::fullscreen_off(Fl_Window *this,int X,int Y,int W,int H)

{
  uint uVar1;
  
  uVar1 = (this->super_Fl_Group).super_Fl_Widget.flags_;
  if ((uVar1 >> 0x12 & 1) == 0 || this->i == (Fl_X *)0x0) {
    (this->super_Fl_Group).super_Fl_Widget.flags_ = uVar1 & 0xfffbffff;
  }
  else {
    fullscreen_off_x(this,X,Y,W,H);
  }
  no_fullscreen_h = 0;
  no_fullscreen_w = 0;
  no_fullscreen_y = 0;
  no_fullscreen_x = 0;
  return;
}

Assistant:

int shown() {return i != 0;}